

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-type.cpp
# Opt level: O1

void __thiscall
yactfr::StructureType::StructureType
          (StructureType *this,uint minAlign,MemberTypes *memberTypes,Up *attrs)

{
  uint uVar1;
  uint align;
  pointer puVar2;
  MemberTypes *__range2;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> local_28;
  
  align = 1;
  for (puVar2 = (memberTypes->
                super__Vector_base<std::unique_ptr<const_yactfr::StructureMemberType,_std::default_delete<const_yactfr::StructureMemberType>_>,_std::allocator<std::unique_ptr<const_yactfr::StructureMemberType,_std::default_delete<const_yactfr::StructureMemberType>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      puVar2 != (memberTypes->
                super__Vector_base<std::unique_ptr<const_yactfr::StructureMemberType,_std::default_delete<const_yactfr::StructureMemberType>_>,_std::allocator<std::unique_ptr<const_yactfr::StructureMemberType,_std::default_delete<const_yactfr::StructureMemberType>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
    uVar1 = *(uint *)((long)(((puVar2->_M_t).
                              super___uniq_ptr_impl<const_yactfr::StructureMemberType,_std::default_delete<const_yactfr::StructureMemberType>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_const_yactfr::StructureMemberType_*,_std::default_delete<const_yactfr::StructureMemberType>_>
                              .super__Head_base<0UL,_const_yactfr::StructureMemberType_*,_false>.
                             _M_head_impl)->_dt)._M_t.
                            super___uniq_ptr_impl<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_>
                     + 0xc);
    if (align <= uVar1) {
      align = uVar1;
    }
  }
  local_28._M_head_impl =
       (attrs->_M_t).
       super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
       super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl;
  (attrs->_M_t).
  super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl = (MapItem *)0x0;
  CompoundDataType::CompoundDataType
            (&this->super_CompoundDataType,_kindStruct,minAlign,align,(Up *)&local_28);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_28);
  (this->super_CompoundDataType).super_DataType._vptr_DataType =
       (_func_int **)&PTR__StructureType_0030b288;
  (this->_memberTypes).
  super__Vector_base<std::unique_ptr<const_yactfr::StructureMemberType,_std::default_delete<const_yactfr::StructureMemberType>_>,_std::allocator<std::unique_ptr<const_yactfr::StructureMemberType,_std::default_delete<const_yactfr::StructureMemberType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (memberTypes->
       super__Vector_base<std::unique_ptr<const_yactfr::StructureMemberType,_std::default_delete<const_yactfr::StructureMemberType>_>,_std::allocator<std::unique_ptr<const_yactfr::StructureMemberType,_std::default_delete<const_yactfr::StructureMemberType>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->_memberTypes).
  super__Vector_base<std::unique_ptr<const_yactfr::StructureMemberType,_std::default_delete<const_yactfr::StructureMemberType>_>,_std::allocator<std::unique_ptr<const_yactfr::StructureMemberType,_std::default_delete<const_yactfr::StructureMemberType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (memberTypes->
       super__Vector_base<std::unique_ptr<const_yactfr::StructureMemberType,_std::default_delete<const_yactfr::StructureMemberType>_>,_std::allocator<std::unique_ptr<const_yactfr::StructureMemberType,_std::default_delete<const_yactfr::StructureMemberType>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  (this->_memberTypes).
  super__Vector_base<std::unique_ptr<const_yactfr::StructureMemberType,_std::default_delete<const_yactfr::StructureMemberType>_>,_std::allocator<std::unique_ptr<const_yactfr::StructureMemberType,_std::default_delete<const_yactfr::StructureMemberType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (memberTypes->
       super__Vector_base<std::unique_ptr<const_yactfr::StructureMemberType,_std::default_delete<const_yactfr::StructureMemberType>_>,_std::allocator<std::unique_ptr<const_yactfr::StructureMemberType,_std::default_delete<const_yactfr::StructureMemberType>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (memberTypes->
  super__Vector_base<std::unique_ptr<const_yactfr::StructureMemberType,_std::default_delete<const_yactfr::StructureMemberType>_>,_std::allocator<std::unique_ptr<const_yactfr::StructureMemberType,_std::default_delete<const_yactfr::StructureMemberType>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (memberTypes->
  super__Vector_base<std::unique_ptr<const_yactfr::StructureMemberType,_std::default_delete<const_yactfr::StructureMemberType>_>,_std::allocator<std::unique_ptr<const_yactfr::StructureMemberType,_std::default_delete<const_yactfr::StructureMemberType>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (memberTypes->
  super__Vector_base<std::unique_ptr<const_yactfr::StructureMemberType,_std::default_delete<const_yactfr::StructureMemberType>_>,_std::allocator<std::unique_ptr<const_yactfr::StructureMemberType,_std::default_delete<const_yactfr::StructureMemberType>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_namesToMemberTypes)._M_h._M_buckets = &(this->_namesToMemberTypes)._M_h._M_single_bucket;
  (this->_namesToMemberTypes)._M_h._M_bucket_count = 1;
  (this->_namesToMemberTypes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_namesToMemberTypes)._M_h._M_element_count = 0;
  (this->_namesToMemberTypes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_namesToMemberTypes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_namesToMemberTypes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  _initNamesToMemberTypes(this);
  return;
}

Assistant:

StructureType::StructureType(const unsigned int minAlign, StructureType::MemberTypes&& memberTypes,
                             MapItem::Up attrs) :
    CompoundDataType {_kindStruct, minAlign, realMinAlign(memberTypes), std::move(attrs)},
    _memberTypes {std::move(memberTypes)}
{
    this->_initNamesToMemberTypes();
}